

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::MakeEchoProgress(cmMakefileTargetGenerator *this,EchoProgress *progress)

{
  string *psVar1;
  ostream *poVar2;
  ostringstream progressArg;
  cmAlphaNum local_1e0;
  string local_1b0;
  cmAlphaNum local_190 [7];
  
  psVar1 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this->LocalGenerator)
  ;
  local_190[0].View_._M_str = (psVar1->_M_dataplus)._M_p;
  local_190[0].View_._M_len = psVar1->_M_string_length;
  local_1e0.View_._M_len = 0xb;
  local_1e0.View_._M_str = "/CMakeFiles";
  cmStrCat<>(&local_1b0,local_190,&local_1e0);
  std::__cxx11::string::operator=((string *)progress,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  poVar2 = std::operator<<((ostream *)local_190,"$(CMAKE_PROGRESS_");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&progress->Arg,(string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return;
}

Assistant:

void cmMakefileTargetGenerator::MakeEchoProgress(
  cmLocalUnixMakefileGenerator3::EchoProgress& progress) const
{
  progress.Dir =
    cmStrCat(this->LocalGenerator->GetBinaryDirectory(), "/CMakeFiles");
  std::ostringstream progressArg;
  progressArg << "$(CMAKE_PROGRESS_" << this->NumberOfProgressActions << ")";
  progress.Arg = progressArg.str();
}